

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiled.cpp
# Opt level: O3

void __thiscall
Rml::DecoratorTiledInstancer::DecoratorTiledInstancer
          (DecoratorTiledInstancer *this,size_t num_tiles)

{
  DecoratorInstancer::DecoratorInstancer(&this->super_DecoratorInstancer);
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorTiledInstancer_0032f208;
  (this->tile_property_ids).
  super__Vector_base<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tile_property_ids).
  super__Vector_base<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tile_property_ids).
  super__Vector_base<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
  ::reserve(&this->tile_property_ids,num_tiles);
  return;
}

Assistant:

DecoratorTiledInstancer::DecoratorTiledInstancer(size_t num_tiles)
{
	tile_property_ids.reserve(num_tiles);
}